

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.h
# Opt level: O3

void psset_alloc_container_remove(psset_t *psset,hpdata_t *ps)

{
  byte bVar1;
  _Bool _Var2;
  pszind_t pVar3;
  hpdata_t *phVar4;
  
  ps->h_in_psset_alloc_container = false;
  if (ps->h_nactive != 0x200) {
    if (ps->h_nactive == 0) {
      phVar4 = (psset->empty).head.qlh_first;
      if (phVar4 == ps) {
        phVar4 = (hpdata_t *)(phVar4->field_13).age_link.link.prev;
        (psset->empty).head.qlh_first = phVar4;
      }
      if (phVar4 == ps) {
        (psset->empty).head.qlh_first = (hpdata_t *)0x0;
      }
      else {
        (((ps->field_13).ql_link_empty.qre_prev)->field_13).age_link.link.prev =
             (((ps->field_13).ql_link_empty.qre_next)->field_13).age_link.link.next;
        phVar4 = (ps->field_13).ql_link_empty.qre_prev;
        (((ps->field_13).ql_link_empty.qre_next)->field_13).ql_link_empty.qre_prev = phVar4;
        (ps->field_13).age_link.link.next = (phVar4->field_13).age_link.link.prev;
        phVar4 = (ps->field_13).ql_link_empty.qre_next;
        (((phVar4->field_13).ql_link_empty.qre_prev)->field_13).ql_link_empty.qre_next = phVar4;
        (((ps->field_13).ql_link_empty.qre_prev)->field_13).ql_link_empty.qre_next = ps;
      }
    }
    else {
      pVar3 = psset_hpdata_heap_index((hpdata_t *)ps->h_longest_free_range);
      duckdb_je_hpdata_age_heap_remove(psset->pageslabs + pVar3,ps);
      _Var2 = duckdb_je_hpdata_age_heap_empty(psset->pageslabs + pVar3);
      if (_Var2) {
        bVar1 = (byte)pVar3 & 0x3f;
        psset->pageslab_bitmap[pVar3 >> 6] =
             psset->pageslab_bitmap[pVar3 >> 6] &
             (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      }
    }
  }
  return;
}

Assistant:

static inline void
hpdata_in_psset_alloc_container_set(hpdata_t *hpdata, bool in_container) {
	assert(in_container != hpdata->h_in_psset_alloc_container);
	hpdata->h_in_psset_alloc_container = in_container;
}